

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O1

int test_contexts_cipher(char *name,int enc,int acpkm)

{
  int iVar1;
  EVP_CIPHER *cipher;
  EVP_CIPHER_CTX *ctx;
  long lVar2;
  EVP_CIPHER_CTX *out;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  EVP_CIPHER_CTX *in;
  int outlen;
  int tmplen;
  size_t v;
  uchar iv [16];
  uchar K [32];
  uchar c [256];
  uchar b [256];
  uchar pt [256];
  uint local_378;
  int local_374;
  long local_370;
  uchar local_368 [48];
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  uchar local_238 [32];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  uchar local_138 [264];
  
  memset(local_138,0,0x100);
  local_138[0] = '\x01';
  local_368[0x20] = '\0';
  local_368[0x21] = '\0';
  local_368[0x22] = '\0';
  local_368[0x23] = '\0';
  local_368[0x24] = '\0';
  local_368[0x25] = '\0';
  local_368[0x26] = '\0';
  local_368[0x27] = '\0';
  local_368[0x28] = '\0';
  local_368[0x29] = '\0';
  local_368[0x2a] = '\0';
  local_368[0x2b] = '\0';
  local_368[0x2c] = '\0';
  local_368[0x2d] = '\0';
  local_368[0x2e] = '\0';
  local_368[0x2f] = '\0';
  local_368[0x10] = '\x01';
  local_368[0x11] = '\0';
  local_368[0x12] = '\0';
  local_368[0x13] = '\0';
  local_368[0x14] = '\0';
  local_368[0x15] = '\0';
  local_368[0x16] = '\0';
  local_368[0x17] = '\0';
  local_368[0x18] = '\0';
  local_368[0x19] = '\0';
  local_368[0x1a] = '\0';
  local_368[0x1b] = '\0';
  local_368[0x1c] = '\0';
  local_368[0x1d] = '\0';
  local_368[0x1e] = '\0';
  local_368[0x1f] = '\0';
  local_368[0] = '\x01';
  local_368[1] = '\0';
  local_368[2] = '\0';
  local_368[3] = '\0';
  local_368[4] = '\0';
  local_368[5] = '\0';
  local_368[6] = '\0';
  local_368[7] = '\0';
  local_368[8] = '\0';
  local_368[9] = '\0';
  local_368[10] = '\0';
  local_368[0xb] = '\0';
  local_368[0xc] = '\0';
  local_368[0xd] = '\0';
  local_368[0xe] = '\0';
  local_368[0xf] = '\0';
  ERR_set_mark();
  cipher = EVP_get_cipherbyname(name);
  if ((cipher == (EVP_CIPHER *)0x0) &&
     (cipher = (EVP_CIPHER *)EVP_CIPHER_fetch(0,name,0), cipher == (EVP_CIPHER *)0x0)) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("(type = (EVP_CIPHER *)EVP_get_cipherbyname(name)) || (type = EVP_CIPHER_fetch(NULL, name, NULL))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0x46);
  }
  ERR_pop_to_mark();
  pcVar4 = "Encryption";
  if (enc == 0) {
    pcVar4 = "Decryption";
  }
  printf("\x1b[1;34m%s test for %s\x1b[m\n",pcVar4,name);
  ctx = EVP_CIPHER_CTX_new();
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0x4e);
  }
  iVar1 = EVP_CipherInit_ex(ctx,cipher,(ENGINE *)0x0,local_368 + 0x10,local_368,enc);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0x4f);
  }
  if (acpkm != 0) {
    lVar2 = EVP_CIPHER_get0_provider(cipher);
    if (lVar2 == 0) {
      iVar1 = EVP_CIPHER_CTX_ctrl(ctx,0x20,acpkm,(void *)0x0);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL)",
                    "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                    ,0x58);
      }
    }
    else {
      local_1f8 = 0;
      uStack_1f0 = 0;
      local_208 = 0;
      uStack_200 = 0;
      local_218 = 0;
      uStack_210 = 0;
      local_238[0x10] = '\0';
      local_238[0x11] = '\0';
      local_238[0x12] = '\0';
      local_238[0x13] = '\0';
      local_238[0x14] = '\0';
      local_238[0x15] = '\0';
      local_238[0x16] = '\0';
      local_238[0x17] = '\0';
      local_238[0x18] = '\0';
      local_238[0x19] = '\0';
      local_238[0x1a] = '\0';
      local_238[0x1b] = '\0';
      local_238[0x1c] = '\0';
      local_238[0x1d] = '\0';
      local_238[0x1e] = '\0';
      local_238[0x1f] = '\0';
      local_238[0] = '\0';
      local_238[1] = '\0';
      local_238[2] = '\0';
      local_238[3] = '\0';
      local_238[4] = '\0';
      local_238[5] = '\0';
      local_238[6] = '\0';
      local_238[7] = '\0';
      local_238[8] = '\0';
      local_238[9] = '\0';
      local_238[10] = '\0';
      local_238[0xb] = '\0';
      local_238[0xc] = '\0';
      local_238[0xd] = '\0';
      local_238[0xe] = '\0';
      local_238[0xf] = '\0';
      local_370 = (long)acpkm;
      OSSL_PARAM_construct_size_t(&local_338,"key-mesh");
      local_218 = local_318;
      iVar1 = EVP_CIPHER_CTX_set_params(ctx);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EVP_CIPHER_CTX_set_params(ctx, params)",
                    "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                    ,0x56);
      }
    }
  }
  iVar1 = EVP_CIPHER_CTX_set_padding(ctx,0);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_CIPHER_CTX_set_padding(ctx, 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0x5b);
  }
  iVar1 = EVP_CipherUpdate(ctx,local_238,(int *)&local_378,local_138,0x100);
  if (iVar1 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_CipherUpdate(ctx, b, &outlen, pt, sizeof(b))",
                "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                ,0x5c);
  }
  iVar1 = EVP_CipherFinal_ex(ctx,local_238 + (int)local_378,&local_374);
  if (iVar1 != 0) {
    EVP_CIPHER_CTX_reset(ctx);
    EVP_CIPHER_CTX_reset(ctx);
    iVar1 = EVP_CipherInit_ex(ctx,cipher,(ENGINE *)0x0,local_368 + 0x10,local_368,enc);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                  ,0x62);
    }
    iVar1 = EVP_CIPHER_CTX_set_padding(ctx,0);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_CIPHER_CTX_set_padding(ctx, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                  ,99);
    }
    if (acpkm != 0) {
      lVar2 = EVP_CIPHER_get0_provider(cipher);
      if (lVar2 == 0) {
        iVar1 = EVP_CIPHER_CTX_ctrl(ctx,0x20,acpkm,(void *)0x0);
        if (iVar1 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL)",
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                      ,0x6c);
        }
      }
      else {
        local_2f8 = 0;
        uStack_2f0 = 0;
        local_308 = 0;
        uStack_300 = 0;
        local_318 = 0;
        uStack_310 = 0;
        local_328 = 0;
        uStack_320 = 0;
        local_338 = 0;
        uStack_330 = 0;
        local_370 = (long)acpkm;
        OSSL_PARAM_construct_size_t(&local_338,"key-mesh");
        iVar1 = EVP_CIPHER_CTX_set_params(ctx);
        if (iVar1 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_CIPHER_CTX_set_params(ctx, params)",
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                      ,0x6a);
        }
      }
    }
    lVar2 = 0;
    printf(" cloned contexts: ");
    memset(&local_338,0,0x100);
    in = ctx;
    do {
      out = EVP_CIPHER_CTX_new();
      if (out == (EVP_CIPHER_CTX *)0x0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("copy",
                    "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                    ,0x76);
      }
      iVar1 = EVP_CIPHER_CTX_copy(out,in);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EVP_CIPHER_CTX_copy(copy, ctx)",
                    "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                    ,0x77);
      }
      if (ctx != in) {
        EVP_CIPHER_CTX_free(in);
      }
      iVar1 = EVP_CipherUpdate(out,(uchar *)((long)&local_338 + lVar2),(int *)&local_378,
                               local_138 + lVar2,0x10);
      if (iVar1 == 0) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("EVP_CipherUpdate(ctx, c + STEP_SIZE * i, &outlen, pt + STEP_SIZE * i, STEP_SIZE)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                    ,0x7d);
      }
      lVar2 = lVar2 + 0x10;
      in = out;
    } while (lVar2 != 0x100);
    local_378 = 0x100;
    iVar1 = EVP_CipherFinal_ex(out,local_238,&local_374);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_CipherFinal_ex(ctx, c + outlen, &tmplen)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                  ,0x81);
    }
    if (local_378 == 0x100) {
      iVar1 = bcmp(&local_338,local_238,0x100);
      uVar5 = (uint)(iVar1 != 0);
      pcVar4 = "\x1b[1;32m  Test passed\x1b[m";
      if (iVar1 != 0) {
        pcVar4 = "\x1b[1;31m  Test FAILED\x1b[m";
      }
    }
    else {
      uVar5 = 1;
      pcVar4 = "\x1b[1;31m  Test FAILED\x1b[m";
    }
    puts(pcVar4);
    EVP_CIPHER_CTX_free(out);
    if (uVar5 != 0) {
      printf("  b[%d] = ",(ulong)local_378);
      hexdump(local_238,(long)(int)local_378);
      printf("  c[%d] = ",(ulong)local_378);
      hexdump(&local_338,(long)(int)local_378);
    }
    printf("    base context: ");
    memset(&local_338,0,0x100);
    iVar1 = EVP_CipherUpdate(ctx,(uchar *)&local_338,(int *)&local_378,local_138,0x100);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_CipherUpdate(save, c, &outlen, pt, sizeof(c))",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                  ,0x8f);
    }
    iVar1 = EVP_CipherFinal_ex(ctx,(uchar *)((long)&local_338 + (long)(int)local_378),&local_374);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_CipherFinal_ex(save, c + outlen, &tmplen)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                  ,0x90);
    }
    if (local_378 == 0x100) {
      iVar1 = bcmp(&local_338,local_238,0x100);
      uVar3 = (uint)(iVar1 != 0);
      pcVar4 = "\x1b[1;32m  Test passed\x1b[m";
      if (iVar1 != 0) {
        pcVar4 = "\x1b[1;31m  Test FAILED\x1b[m";
      }
    }
    else {
      uVar3 = 1;
      pcVar4 = "\x1b[1;31m  Test FAILED\x1b[m";
    }
    puts(pcVar4);
    EVP_CIPHER_CTX_reset(ctx);
    EVP_CIPHER_CTX_reset(ctx);
    EVP_CIPHER_CTX_free(ctx);
    EVP_CIPHER_free(cipher);
    if (uVar3 != 0) {
      printf("  b[%d] = ",(ulong)local_378);
      hexdump(local_238,(long)(int)local_378);
      printf("  c[%d] = ",(ulong)local_378);
      hexdump(&local_338,(long)(int)local_378);
    }
    return uVar3 | uVar5;
  }
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_CipherFinal_ex(ctx, b + outlen, &tmplen)",
              "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
              ,0x5d);
}

Assistant:

static int test_contexts_cipher(const char *name, const int enc, int acpkm)
{
    EVP_CIPHER_CTX *ctx, *save;
    unsigned char pt[TEST_SIZE] = {1};
    unsigned char b[TEST_SIZE]; /* base output */
    unsigned char c[TEST_SIZE]; /* cloned output */
    unsigned char K[32] = {1};
    unsigned char iv[16] = {1};
    int outlen, tmplen;
    int ret = 0, test = 0;

    EVP_CIPHER *type;
    ERR_set_mark();
    T((type = (EVP_CIPHER *)EVP_get_cipherbyname(name))
      || (type = EVP_CIPHER_fetch(NULL, name, NULL)));
    ERR_pop_to_mark();

    printf(cBLUE "%s test for %s" cNORM "\n",
           enc ? "Encryption" : "Decryption", name);

    /* produce base encryption */
    ctx = EVP_CIPHER_CTX_new();
    T(ctx);
    T(EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc));
    if (acpkm) {
	if (EVP_CIPHER_get0_provider(type) != NULL) {
	    OSSL_PARAM params[] = { OSSL_PARAM_END, OSSL_PARAM_END };
	    size_t v = (size_t)acpkm;

	    params[0] = OSSL_PARAM_construct_size_t("key-mesh", &v);
	    T(EVP_CIPHER_CTX_set_params(ctx, params));
	} else {
	    T(EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL));
	}
    }
    T(EVP_CIPHER_CTX_set_padding(ctx, 0));
    T(EVP_CipherUpdate(ctx, b, &outlen, pt, sizeof(b)));
    T(EVP_CipherFinal_ex(ctx, b + outlen, &tmplen));

    /* and now tests */
    EVP_CIPHER_CTX_reset(ctx);
    EVP_CIPHER_CTX_reset(ctx); /* double call is intentional */
    T(EVP_CipherInit_ex(ctx, type, NULL, K, iv, enc));
    T(EVP_CIPHER_CTX_set_padding(ctx, 0));
    if (acpkm) {
	if (EVP_CIPHER_get0_provider(type) != NULL) {
	    OSSL_PARAM params[] = { OSSL_PARAM_END, OSSL_PARAM_END };
	    size_t v = (size_t)acpkm;

	    params[0] = OSSL_PARAM_construct_size_t("key-mesh", &v);
	    T(EVP_CIPHER_CTX_set_params(ctx, params));
	} else {
	    T(EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_KEY_MESH, acpkm, NULL));
	}
    }
    save = ctx;

    printf(" cloned contexts: ");
    int i;
    memset(c, 0, sizeof(c));
    for (i = 0; i < TEST_SIZE / STEP_SIZE; i++) {
	EVP_CIPHER_CTX *copy = EVP_CIPHER_CTX_new();
	T(copy);
	T(EVP_CIPHER_CTX_copy(copy, ctx));
	if (save != ctx) /* else original context */
	    EVP_CIPHER_CTX_free(ctx);
	ctx = copy;

	T(EVP_CipherUpdate(ctx, c + STEP_SIZE * i, &outlen,
			   pt + STEP_SIZE * i, STEP_SIZE));
    }

    outlen = i * STEP_SIZE;
    T(EVP_CipherFinal_ex(ctx, c + outlen, &tmplen));
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, TEST_SIZE));
    EVP_CIPHER_CTX_free(ctx);
    if (test) {
	printf("  b[%d] = ", outlen);
	hexdump(b, outlen);
	printf("  c[%d] = ", outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    /* resume original context */
    printf("    base context: ");
    memset(c, 0, sizeof(c));
    T(EVP_CipherUpdate(save, c, &outlen, pt, sizeof(c)));
    T(EVP_CipherFinal_ex(save, c + outlen, &tmplen));
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, TEST_SIZE));
    EVP_CIPHER_CTX_cleanup(save); /* multiple calls are intentional */
    EVP_CIPHER_CTX_cleanup(save);
    EVP_CIPHER_CTX_free(save);
    EVP_CIPHER_free(type);
    if (test) {
	printf("  b[%d] = ", outlen);
	hexdump(b, outlen);
	printf("  c[%d] = ", outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    return ret;
}